

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O3

int __thiscall rcg::Interface::open(Interface *this,char *__file,int __oflag,...)

{
  PTLUpdateInterfaceList p_Var1;
  PTLOpenInterface p_Var2;
  int iVar3;
  GC_ERROR GVar4;
  void *pvVar5;
  GenTLException *this_00;
  int __oflag_00;
  char *pcVar6;
  string local_48;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx);
  if (iVar3 == 0) {
    iVar3 = this->n_open;
    if (iVar3 == 0) {
      System::open((this->parent).super___shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   ,__file,__oflag_00);
      p_Var1 = ((this->gentl).
                super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               TLUpdateInterfaceList;
      pvVar5 = System::getHandle((this->parent).
                                 super___shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
      (*p_Var1)(pvVar5,(bool8_t *)0x0,10);
      p_Var2 = ((this->gentl).
                super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               TLOpenInterface;
      pvVar5 = System::getHandle((this->parent).
                                 super___shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
      pcVar6 = (this->id)._M_dataplus._M_p;
      GVar4 = (*p_Var2)(pvVar5,pcVar6,&this->ifh);
      iVar3 = (int)pcVar6;
      if (GVar4 != 0) goto LAB_0010b2ff;
      iVar3 = this->n_open;
    }
    this->n_open = iVar3 + 1;
    iVar3 = pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
    return iVar3;
  }
  std::__throw_system_error(iVar3);
  iVar3 = (int)__file;
LAB_0010b2ff:
  System::close((this->parent).super___shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                iVar3);
  this_00 = (GenTLException *)__cxa_allocate_exception(0x28);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Interface::open()","");
  GenTLException::GenTLException(this_00,&local_48,&this->gentl);
  __cxa_throw(this_00,&GenTLException::typeinfo,GenTLException::~GenTLException);
}

Assistant:

void Interface::open()
{
  std::lock_guard<std::mutex> lock(mtx);

  if (n_open == 0)
  {
    parent->open();

    // updating before opening is apparently necessary for some TLs

    gentl->TLUpdateInterfaceList(parent->getHandle(), 0, 10);

    if (gentl->TLOpenInterface(parent->getHandle(), id.c_str(), &ifh) != GenTL::GC_ERR_SUCCESS)
    {
      parent->close();
      throw GenTLException("Interface::open()", gentl);
    }
  }

  n_open++;
}